

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O0

int32_t __thiscall icu_63::CopticCalendar::handleGetExtendedYear(CopticCalendar *this)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  undefined4 local_14;
  int32_t era;
  int32_t eyear;
  CopticCalendar *this_local;
  
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar1 == UCAL_EXTENDED_YEAR) {
    local_14 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR,1);
  }
  else {
    iVar2 = Calendar::internalGet((Calendar *)this,UCAL_ERA,1);
    if (iVar2 == 0) {
      local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
      local_14 = 1 - local_14;
    }
    else {
      local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
    }
  }
  return local_14;
}

Assistant:

int32_t
CopticCalendar::handleGetExtendedYear()
{
    int32_t eyear;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        eyear = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        // The year defaults to the epoch start, the era to CE
        int32_t era = internalGet(UCAL_ERA, CE);
        if (era == BCE) {
            eyear = 1 - internalGet(UCAL_YEAR, 1); // Convert to extended year
        } else {
            eyear = internalGet(UCAL_YEAR, 1); // Default to year 1
        }
    }
    return eyear;
}